

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_texture * djgt_create(int req_comp)

{
  djg_texture *pdVar1;
  bool local_19;
  djg_texture *head;
  int req_comp_local;
  
  pdVar1 = (djg_texture *)malloc(0x20);
  local_19 = 4 < (uint)req_comp;
  if (local_19) {
    __assert_fail("req_comp >= 0 && req_comp <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x30e,"djg_texture *djgt_create(int)");
  }
  pdVar1->next = (djg_texture *)0x0;
  pdVar1->texels = (char *)0x0;
  pdVar1->x = 0;
  pdVar1->y = 0;
  pdVar1->comp = req_comp;
  pdVar1->pf = 0;
  return pdVar1;
}

Assistant:

DJGDEF djg_texture *djgt_create(int req_comp)
{
    djg_texture *head = (djg_texture*)DJG_MALLOC(sizeof(*head));

    DJG_ASSERT(req_comp >= 0 && req_comp <= 4);
    head->next = NULL;
    head->texels = NULL;
    head->x = 0;
    head->y = 0;
    head->comp = req_comp;
    head->pf = DJGT_PF_INVALID;

    return head;
}